

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
Outputs::Display::OpenGL::Shader::set_uniform
          (Shader *this,string *name,GLint size,GLsizei count,GLuint *values)

{
  uint *__last;
  anon_class_72_5_a6dfc461_conflict1 local_c8;
  function<void_()> local_80;
  allocator<unsigned_int> local_49;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values_copy;
  size_t number_of_values;
  GLuint *values_local;
  GLsizei count_local;
  GLint size_local;
  string *name_local;
  Shader *this_local;
  
  values_copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)count * (long)size);
  __last = values + (long)values_copy.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_int>::allocator(&local_49);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_48,values,__last,&local_49);
  std::allocator<unsigned_int>::~allocator(&local_49);
  std::__cxx11::string::string((string *)&local_c8,(string *)name);
  local_c8.size = size;
  local_c8.count = count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c8.values_copy,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  local_c8.this = this;
  std::function<void()>::
  function<Outputs::Display::OpenGL::Shader::set_uniform(std::__cxx11::string_const&,int,int,unsigned_int_const*)::__0,void>
            ((function<void()> *)&local_80,&local_c8);
  enqueue_function(this,&local_80);
  std::function<void_()>::~function(&local_80);
  set_uniform(std::__cxx11::string_const&,int,int,unsigned_int_const*)::$_0::~__0((__0 *)&local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void Shader::set_uniform(const std::string &name, GLint size, GLsizei count, const GLuint *values) {
	std::size_t number_of_values = std::size_t(count) * std::size_t(size);
	std::vector<GLuint> values_copy(values, values + number_of_values);

	enqueue_function([name, size, count, values_copy, this] {
		switch(size) {
			case 1: with_location(glUniform1uiv, count, values_copy.data());	break;
			case 2: with_location(glUniform2uiv, count, values_copy.data());	break;
			case 3: with_location(glUniform3uiv, count, values_copy.data());	break;
			case 4: with_location(glUniform4uiv, count, values_copy.data());	break;
		}
	});
}